

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observer.h
# Opt level: O3

void __thiscall libsgp4::Observer::Observer(Observer *this,CoordGeodetic *geo)

{
  double dVar1;
  DateTime local_20;
  
  (this->m_geo).latitude = 0.0;
  (this->m_geo).longitude = 0.0;
  (this->m_geo).altitude = 0.0;
  dVar1 = geo->longitude;
  (this->m_geo).latitude = geo->latitude;
  (this->m_geo).longitude = dVar1;
  (this->m_geo).altitude = geo->altitude;
  local_20.m_encoded = 0;
  DateTime::Initialise(&local_20,1,1,1,0,0,0,0);
  Eci::Eci(&this->m_eci,&local_20,geo);
  return;
}

Assistant:

explicit Observer(const CoordGeodetic &geo)
        : m_geo(geo)
        , m_eci(DateTime(), geo)
    {
    }